

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView_const&>
          (QVLABase<QByteArrayView> *this,qsizetype prealloc,void *array,QByteArrayView *args)

{
  qsizetype *pqVar1;
  void *pvVar2;
  storage_type *psVar3;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  psVar3 = args->m_data;
  pqVar1 = (qsizetype *)((long)pvVar2 + asize * 0x10);
  *pqVar1 = args->m_size;
  pqVar1[1] = (qsizetype)psVar3;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + asize * 0x10);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }